

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall QGraphicsScenePrivate::_q_updateScenePosDescendants(QGraphicsScenePrivate *this)

{
  uint *puVar1;
  ulong uVar2;
  Data *pDVar3;
  ulong uVar4;
  long lVar5;
  
  pDVar3 = (this->scenePosItems).q_hash.d;
  if (pDVar3 == (Data *)0x0) {
    pDVar3 = (Data *)0x0;
    uVar4 = 0;
LAB_005ff186:
    if (pDVar3 == (Data *)0x0 && uVar4 == 0) goto LAB_005ff229;
  }
  else {
    if (pDVar3->spans->offsets[0] == 0xff) {
      uVar2 = 1;
      do {
        uVar4 = uVar2;
        if (pDVar3->numBuckets == uVar4) {
          pDVar3 = (Data *)0x0;
          uVar4 = 0;
          break;
        }
        uVar2 = uVar4 + 1;
      } while (pDVar3->spans[uVar4 >> 7].offsets[(uint)uVar4 & 0x7f] == 0xff);
      goto LAB_005ff186;
    }
    uVar4 = 0;
  }
  do {
    lVar5 = *(long *)pDVar3->spans[uVar4 >> 7].entries
                     [pDVar3->spans[uVar4 >> 7].offsets[(uint)uVar4 & 0x7f]].storage.data;
    while (lVar5 = *(long *)(*(long *)(lVar5 + 8) + 0x90), lVar5 != 0) {
      puVar1 = (uint *)(*(long *)(lVar5 + 8) + 0x168);
      *puVar1 = *puVar1 | 0x80;
    }
    do {
      if (pDVar3->numBuckets - 1 == uVar4) {
        pDVar3 = (Data *)0x0;
        uVar4 = 0;
        break;
      }
      uVar4 = uVar4 + 1;
    } while (pDVar3->spans[uVar4 >> 7].offsets[(uint)uVar4 & 0x7f] == 0xff);
  } while ((pDVar3 != (Data *)0x0) || (uVar4 != 0));
LAB_005ff229:
  this->field_0xb9 = this->field_0xb9 & 0xfe;
  return;
}

Assistant:

inline const_iterator begin() const noexcept { return d ? const_iterator(d->begin()): const_iterator(); }